

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jpgd.cpp
# Opt level: O0

void __thiscall jpgd::jpeg_decoder::read_dht_marker(jpeg_decoder *this)

{
  undefined8 *puVar1;
  uint uVar2;
  void *pvVar3;
  long in_RDI;
  int s;
  bool symbol_present [256];
  uint num_left;
  uint8 huff_val [256];
  uint8 huff_num [17];
  int count;
  int index;
  int i;
  jpgd_status status;
  undefined4 in_stack_fffffffffffffdc0;
  uint in_stack_fffffffffffffdc4;
  jpeg_decoder *in_stack_fffffffffffffdc8;
  undefined1 in_stack_fffffffffffffdf7;
  size_t in_stack_fffffffffffffdf8;
  jpeg_decoder *in_stack_fffffffffffffe00;
  uint local_12c;
  undefined1 local_128 [256];
  byte local_28;
  undefined7 uStack_27;
  undefined8 local_20;
  undefined1 local_18;
  int local_14;
  uint local_10;
  uint local_c;
  
  uVar2 = get_bits(in_stack_fffffffffffffdc8,in_stack_fffffffffffffdc4);
  status = (jpgd_status)((ulong)in_RDI >> 0x20);
  if (uVar2 < 2) {
    stop_decoding((jpeg_decoder *)CONCAT44(in_stack_fffffffffffffdc4,in_stack_fffffffffffffdc0),
                  status);
  }
  local_12c = uVar2 - 2;
  while( true ) {
    if (local_12c == 0) {
      return;
    }
    local_10 = get_bits(in_stack_fffffffffffffdc8,in_stack_fffffffffffffdc4);
    local_28 = 0;
    local_14 = 0;
    for (local_c = 1; (int)local_c < 0x11; local_c = local_c + 1) {
      uVar2 = get_bits(in_stack_fffffffffffffdc8,in_stack_fffffffffffffdc4);
      (&local_28)[(int)local_c] = (byte)uVar2;
      local_14 = (uint)(&local_28)[(int)local_c] + local_14;
    }
    if (0xff < local_14) {
      stop_decoding((jpeg_decoder *)CONCAT44(in_stack_fffffffffffffdc4,in_stack_fffffffffffffdc0),
                    status);
    }
    memset(&stack0xfffffffffffffdc8,0,0x100);
    for (local_c = 0; (int)local_c < local_14; local_c = local_c + 1) {
      in_stack_fffffffffffffdc4 = get_bits(in_stack_fffffffffffffdc8,in_stack_fffffffffffffdc4);
      if (((&stack0xfffffffffffffdc8)[(int)in_stack_fffffffffffffdc4] & 1) != 0) {
        stop_decoding((jpeg_decoder *)CONCAT44(in_stack_fffffffffffffdc4,in_stack_fffffffffffffdc0),
                      status);
      }
      local_128[(int)local_c] = (char)in_stack_fffffffffffffdc4;
      (&stack0xfffffffffffffdc8)[(int)in_stack_fffffffffffffdc4] = 1;
    }
    local_c = local_14 + 0x11;
    if (local_12c < local_c) {
      stop_decoding((jpeg_decoder *)CONCAT44(in_stack_fffffffffffffdc4,in_stack_fffffffffffffdc0),
                    status);
    }
    local_12c = local_12c - local_c;
    if (0x10 < (local_10 & 0x10)) break;
    local_10 = (local_10 & 0xf) + ((int)(local_10 & 0x10) >> 4) * 4;
    if (7 < local_10) {
      stop_decoding((jpeg_decoder *)CONCAT44(in_stack_fffffffffffffdc4,in_stack_fffffffffffffdc0),
                    status);
    }
    if (*(long *)(in_RDI + 0xf8 + (long)(int)local_10 * 8) == 0) {
      pvVar3 = alloc(in_stack_fffffffffffffe00,in_stack_fffffffffffffdf8,
                     (bool)in_stack_fffffffffffffdf7);
      *(void **)(in_RDI + 0xf8 + (long)(int)local_10 * 8) = pvVar3;
    }
    if (*(long *)(in_RDI + 0x138 + (long)(int)local_10 * 8) == 0) {
      pvVar3 = alloc(in_stack_fffffffffffffe00,in_stack_fffffffffffffdf8,
                     (bool)in_stack_fffffffffffffdf7);
      *(void **)(in_RDI + 0x138 + (long)(int)local_10 * 8) = pvVar3;
    }
    *(bool *)(in_RDI + 0xec + (long)(int)local_10) = (local_10 & 0x10) != 0;
    puVar1 = *(undefined8 **)(in_RDI + 0xf8 + (long)(int)local_10 * 8);
    *puVar1 = CONCAT71(uStack_27,local_28);
    puVar1[1] = local_20;
    *(undefined1 *)(puVar1 + 2) = local_18;
    memcpy(*(void **)(in_RDI + 0x138 + (long)(int)local_10 * 8),local_128,0x100);
  }
  stop_decoding((jpeg_decoder *)CONCAT44(in_stack_fffffffffffffdc4,in_stack_fffffffffffffdc0),status
               );
}

Assistant:

void jpeg_decoder::read_dht_marker()
	{
		int i, index, count;
		uint8 huff_num[17];
		uint8 huff_val[256];

		uint num_left = get_bits(16);

		if (num_left < 2)
			stop_decoding(JPGD_BAD_DHT_MARKER);

		num_left -= 2;

		while (num_left)
		{
			index = get_bits(8);

			huff_num[0] = 0;

			count = 0;

			for (i = 1; i <= 16; i++)
			{
				huff_num[i] = static_cast<uint8>(get_bits(8));
				count += huff_num[i];
			}

			if (count > 255)
				stop_decoding(JPGD_BAD_DHT_COUNTS);

			bool symbol_present[256];
			memset(symbol_present, 0, sizeof(symbol_present));

			for (i = 0; i < count; i++)
			{
				const int s = get_bits(8);

				// Check for obviously bogus tables.
				if (symbol_present[s])
					stop_decoding(JPGD_BAD_DHT_COUNTS);

				huff_val[i] = static_cast<uint8_t>(s);
				symbol_present[s] = true;
			}

			i = 1 + 16 + count;

			if (num_left < (uint)i)
				stop_decoding(JPGD_BAD_DHT_MARKER);

			num_left -= i;

			if ((index & 0x10) > 0x10)
				stop_decoding(JPGD_BAD_DHT_INDEX);

			index = (index & 0x0F) + ((index & 0x10) >> 4) * (JPGD_MAX_HUFF_TABLES >> 1);

			if (index >= JPGD_MAX_HUFF_TABLES)
				stop_decoding(JPGD_BAD_DHT_INDEX);

			if (!m_huff_num[index])
				m_huff_num[index] = (uint8*)alloc(17);

			if (!m_huff_val[index])
				m_huff_val[index] = (uint8*)alloc(256);

			m_huff_ac[index] = (index & 0x10) != 0;
			memcpy(m_huff_num[index], huff_num, 17);
			memcpy(m_huff_val[index], huff_val, 256);
		}
	}